

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O2

void cmServer::reportProgress(char *msg,float progress,void *data)

{
  allocator local_4e;
  allocator local_4d;
  float local_4c;
  string local_48;
  string local_28;
  
  if (data != (void *)0x0) {
    if ((progress < 0.0) || (1.0 < progress)) {
      std::__cxx11::string::string((string *)&local_48,msg,&local_4d);
      std::__cxx11::string::string((string *)&local_28,"",&local_4e);
      cmServerRequest::ReportMessage((cmServerRequest *)data,&local_48,&local_28);
      std::__cxx11::string::~string((string *)&local_28);
    }
    else {
      local_4c = progress;
      std::__cxx11::string::string((string *)&local_48,msg,(allocator *)&local_28);
      cmServerRequest::ReportProgress
                ((cmServerRequest *)data,0,(int)(local_4c * 1000.0),1000,&local_48);
    }
    std::__cxx11::string::~string((string *)&local_48);
    return;
  }
  __assert_fail("request",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServer.cxx"
                ,0x98,"static void cmServer::reportProgress(const char *, float, void *)");
}

Assistant:

void cmServer::reportProgress(const char* msg, float progress, void* data)
{
  const cmServerRequest* request = static_cast<const cmServerRequest*>(data);
  assert(request);
  if (progress < 0.0f || progress > 1.0f) {
    request->ReportMessage(msg, "");
  } else {
    request->ReportProgress(0, static_cast<int>(progress * 1000), 1000, msg);
  }
}